

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lite_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::
LiteTest_NestedEnumValueToName_Test<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::~LiteTest_NestedEnumValueToName_Test
          (LiteTest_NestedEnumValueToName_Test<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this)

{
  LiteTest_NestedEnumValueToName_Test<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  ~LiteTest_NestedEnumValueToName_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TYPED_TEST(LiteTest, NestedEnumValueToName) {
  EXPECT_EQ("FOO", proto2_unittest::TestAllTypesLite::NestedEnum_Name(
                       proto2_unittest::TestAllTypesLite::FOO));
  EXPECT_EQ("BAR", proto2_unittest::TestAllTypesLite::NestedEnum_Name(
                       proto2_unittest::TestAllTypesLite::BAR));
  EXPECT_EQ("BAZ", proto2_unittest::TestAllTypesLite::NestedEnum_Name(
                       proto2_unittest::TestAllTypesLite::BAZ));
  EXPECT_EQ("", proto2_unittest::TestAllTypesLite::NestedEnum_Name(0));
  EXPECT_EQ("", proto2_unittest::TestAllTypesLite::NestedEnum_Name(999));
}